

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_generic_field_getters
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  ostream *poVar3;
  reference pptVar4;
  string *psVar5;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  string field_name;
  t_field *field;
  t_field **local_98;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_78;
  allocator local_41;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar3,"getFieldValue(int fieldID)");
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40," ",&local_41);
  scope_up(this,(ostream *)ptVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  std::operator<<(poVar3,"switch (fieldID)");
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78," ",(allocator *)((long)&fields + 7));
  scope_up(this,(ostream *)ptVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fields + 7));
  f_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_90);
  local_98 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_90._M_current = local_98;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_90,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar2) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_90);
    field_name.field_2._8_8_ = *pptVar4;
    psVar5 = t_field::get_name_abi_cxx11_((t_field *)field_name.field_2._8_8_);
    std::__cxx11::string::string((string *)&local_e8,(string *)psVar5);
    get_member_name((string *)local_c8,this,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar3 = std::operator<<(poVar3,"case ");
    std::__cxx11::string::string((string *)&local_128,(string *)local_c8);
    t_oop_generator::upcase_string(&local_108,&this->super_t_oop_generator,&local_128);
    poVar3 = std::operator<<(poVar3,(string *)&local_108);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    t_generator::indent_up((t_generator *)this);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar3 = std::operator<<(poVar3,"return this.");
    poVar3 = std::operator<<(poVar3,(string *)local_c8);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    std::__cxx11::string::~string((string *)local_c8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_90);
  }
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar3 = std::operator<<(poVar3,"default:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar3 = std::operator<<(poVar3,"throw new ArgumentError(\"Field $fieldID doesn\'t exist!\");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  std::__cxx11::string::string((string *)&local_148,(string *)&::endl_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  ptVar1 = tstruct_local;
  std::__cxx11::string::string((string *)&local_168,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  return;
}

Assistant:

void t_dart_generator::generate_generic_field_getters(std::ostream& out,
                                                      t_struct* tstruct) {
  // create the getter
  indent(out) << "getFieldValue(int fieldID)";
  scope_up(out);

  indent(out) << "switch (fieldID)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    std::string field_name = get_member_name(field->get_name());

    indent(out) << "case " << upcase_string(field_name) << ":" << endl;
    indent_up();
    indent(out) << "return this." << field_name << ";" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent_up();
  indent(out) << "throw new ArgumentError(\"Field $fieldID doesn't exist!\");" << endl;
  indent_down();

  scope_down(out);  // switch
  scope_down(out, endl2);  // method
}